

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O0

FileInfo * __thiscall
llbuild::basic::DeviceAgnosticFileSystem::getFileInfo
          (FileInfo *__return_storage_ptr__,DeviceAgnosticFileSystem *this,string *path)

{
  pointer pFVar1;
  FileInfo *info;
  string *path_local;
  DeviceAgnosticFileSystem *this_local;
  
  pFVar1 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->(&this->impl);
  (*pFVar1->_vptr_FileSystem[7])(__return_storage_ptr__,pFVar1,path);
  __return_storage_ptr__->device = 0;
  __return_storage_ptr__->inode = 0;
  return __return_storage_ptr__;
}

Assistant:

virtual FileInfo getFileInfo(const std::string& path) override {
    auto info = impl->getFileInfo(path);

    // Device and inode numbers may (will) change when relocating files to
    // another device. Here we explicitly, unconditionally override them with 0,
    // enabling an entire build tree to be relocated or copied yet retain the
    // ability to perform incremental builds.
    info.device = 0;
    info.inode = 0;

    return info;
  }